

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O0

void __thiscall QWhatsThat::mouseMoveEvent(QWhatsThat *this,QMouseEvent *e)

{
  bool bVar1;
  QPoint *p;
  QPoint *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QString a;
  QPointF *this_00;
  QCursor in_stack_ffffffffffffff98;
  QCursor local_60 [2];
  QPointF local_50;
  QPoint local_40;
  QPoint local_38;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI[5].yp != 0.0) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = in_RDI;
    p = (QPoint *)QTextDocument::documentLayout();
    local_50 = QSinglePointEvent::position((QSinglePointEvent *)0x4c354c);
    local_40 = QPointF::toPoint(this_00);
    QPoint::QPoint((QPoint *)in_RDI,(int)((ulong)p >> 0x20),(int)p);
    local_38 = ::operator-((QPoint *)this_00,in_RSI);
    QPointF::QPointF(in_RDI,p);
    QAbstractTextDocumentLayout::anchorAt((QPointF *)&local_20);
    bVar1 = QString::isEmpty((QString *)0x4c35bb);
    if (bVar1) {
      QCursor::QCursor((QCursor *)&stack0xffffffffffffff98,ArrowCursor);
      QWidget::setCursor((QWidget *)in_stack_ffffffffffffff98.d,(QCursor *)this_00);
      QCursor::~QCursor((QCursor *)&stack0xffffffffffffff98);
    }
    else {
      QCursor::QCursor(local_60,PointingHandCursor);
      QWidget::setCursor((QWidget *)in_stack_ffffffffffffff98.d,(QCursor *)this_00);
      QCursor::~QCursor(local_60);
    }
    QString::~QString((QString *)0x4c3618);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWhatsThat::mouseMoveEvent(QMouseEvent* e)
{
#ifdef QT_NO_CURSOR
    Q_UNUSED(e);
#else
    if (!doc)
        return;
    QString a = doc->documentLayout()->anchorAt(e->position().toPoint() -  QPoint(hMargin, vMargin));
    if (!a.isEmpty())
        setCursor(Qt::PointingHandCursor);
    else
        setCursor(Qt::ArrowCursor);
#endif
}